

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myassert.h
# Opt level: O2

void ASSERT_RE(string *actual,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  regex re;
  
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&re,expected,0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (actual,&re,0);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&re);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Assertion failed:\nExpected:\n");
  poVar2 = std::operator<<(poVar2,(string *)expected);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"but got:\n");
  poVar2 = std::operator<<(poVar2,(string *)actual);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void ASSERT_RE(std::string actual, std::string expected) {
  std::regex re(expected);
  if (regex_match(actual, re))
    return;
  std::cerr << "Assertion failed:\n"
               "Expected:\n"
            << expected << "\n"
            << "but got:\n"
            << actual << std::endl;
  std::exit(1);
}